

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::node_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::node_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
                  *this,node_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                        *container,MatchResultListener *listener)

{
  char cVar1;
  unique_ptr<int,_std::default_delete<int>_> *puVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  bool bVar20;
  pointer pcVar21;
  uint uVar22;
  ulong uVar23;
  size_t sVar24;
  slot_type *pptVar25;
  pointer pMVar26;
  long lVar27;
  size_t sVar28;
  long lVar29;
  unique_ptr<int,_std::default_delete<int>_> *puVar30;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  vector<char,_std::allocator<char>_> did_match;
  MatchMatrix matrix;
  DummyMatchResultListener dummy;
  allocator_type local_d9;
  unique_ptr<int,_std::default_delete<int>_> *local_d8;
  MatchResultListener *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  size_t local_b0;
  undefined1 local_a8 [16];
  pointer local_98;
  string local_88;
  MatchMatrix local_68;
  MatchResultListener local_40;
  
  puVar2 = (unique_ptr<int,_std::default_delete<int>_> *)
           (container->
           super_raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           ).ctrl_;
  pptVar25 = (container->
             super_raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             ).slots_;
  cVar1 = *(char *)&(puVar2->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
  puVar30 = puVar2;
  while (cVar1 < -1) {
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar9 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*(char *)&(puVar30->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>.
                             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl < (char)iVar8);
    in_XMM1_Bb = -(*(char *)((long)&(puVar30->_M_t).
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 1) <
                  (char)((uint)iVar8 >> 8));
    in_XMM1_Bc = -(*(char *)((long)&(puVar30->_M_t).
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 2) <
                  (char)((uint)iVar8 >> 0x10));
    in_XMM1_Bd = -(*(char *)((long)&(puVar30->_M_t).
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 3) <
                  (char)((uint)iVar8 >> 0x18));
    in_XMM1_Be = -(*(char *)((long)&(puVar30->_M_t).
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) <
                  (char)iVar9);
    in_XMM1_Bf = -(*(char *)((long)&(puVar30->_M_t).
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 5) <
                  (char)((uint)iVar9 >> 8));
    in_XMM1_Bg = -(*(char *)((long)&(puVar30->_M_t).
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 6) <
                  (char)((uint)iVar9 >> 0x10));
    in_XMM1_Bh = -(*(char *)((long)&(puVar30->_M_t).
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 7) <
                  (char)((uint)iVar9 >> 0x18));
    in_XMM1_Bi = -(*(char *)&puVar30[1]._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
                             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl < (char)iVar10);
    in_XMM1_Bj = -(*(char *)((long)&puVar30[1]._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 1) <
                  (char)((uint)iVar10 >> 8));
    in_XMM1_Bk = -(*(char *)((long)&puVar30[1]._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 2) <
                  (char)((uint)iVar10 >> 0x10));
    in_XMM1_Bl = -(*(char *)((long)&puVar30[1]._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 3) <
                  (char)((uint)iVar10 >> 0x18));
    in_XMM1_Bm = -(*(char *)((long)&puVar30[1]._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) <
                  (char)iVar11);
    in_XMM1_Bn = -(*(char *)((long)&puVar30[1]._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 5) <
                  (char)((uint)iVar11 >> 8));
    in_XMM1_Bo = -(*(char *)((long)&puVar30[1]._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 6) <
                  (char)((uint)iVar11 >> 0x10));
    in_XMM1_Bp = -(*(char *)((long)&puVar30[1]._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 7) <
                  (char)((uint)iVar11 >> 0x18));
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar5[1] = in_XMM1_Bb;
    auVar5[0] = in_XMM1_Ba;
    auVar5[2] = in_XMM1_Bc;
    auVar5[3] = in_XMM1_Bd;
    auVar5[4] = in_XMM1_Be;
    auVar5[5] = in_XMM1_Bf;
    auVar5[6] = in_XMM1_Bg;
    auVar5[7] = in_XMM1_Bh;
    auVar5[8] = in_XMM1_Bi;
    auVar5[9] = in_XMM1_Bj;
    auVar5[10] = in_XMM1_Bk;
    auVar5[0xb] = in_XMM1_Bl;
    auVar5[0xc] = in_XMM1_Bm;
    auVar5[0xd] = in_XMM1_Bn;
    auVar5[0xe] = in_XMM1_Bo;
    auVar5[0xf] = in_XMM1_Bp;
    auVar18[1] = in_XMM1_Bd;
    auVar18[0] = in_XMM1_Bc;
    auVar18[2] = in_XMM1_Be;
    auVar18[3] = in_XMM1_Bf;
    auVar18[4] = in_XMM1_Bg;
    auVar18[5] = in_XMM1_Bh;
    auVar18[6] = in_XMM1_Bi;
    auVar18[7] = in_XMM1_Bj;
    auVar18[8] = in_XMM1_Bk;
    auVar18[9] = in_XMM1_Bl;
    auVar18[10] = in_XMM1_Bm;
    auVar18[0xb] = in_XMM1_Bn;
    auVar18[0xc] = in_XMM1_Bo;
    auVar18[0xd] = in_XMM1_Bp;
    auVar16[1] = in_XMM1_Be;
    auVar16[0] = in_XMM1_Bd;
    auVar16[2] = in_XMM1_Bf;
    auVar16[3] = in_XMM1_Bg;
    auVar16[4] = in_XMM1_Bh;
    auVar16[5] = in_XMM1_Bi;
    auVar16[6] = in_XMM1_Bj;
    auVar16[7] = in_XMM1_Bk;
    auVar16[8] = in_XMM1_Bl;
    auVar16[9] = in_XMM1_Bm;
    auVar16[10] = in_XMM1_Bn;
    auVar16[0xb] = in_XMM1_Bo;
    auVar16[0xc] = in_XMM1_Bp;
    auVar14[1] = in_XMM1_Bf;
    auVar14[0] = in_XMM1_Be;
    auVar14[2] = in_XMM1_Bg;
    auVar14[3] = in_XMM1_Bh;
    auVar14[4] = in_XMM1_Bi;
    auVar14[5] = in_XMM1_Bj;
    auVar14[6] = in_XMM1_Bk;
    auVar14[7] = in_XMM1_Bl;
    auVar14[8] = in_XMM1_Bm;
    auVar14[9] = in_XMM1_Bn;
    auVar14[10] = in_XMM1_Bo;
    auVar14[0xb] = in_XMM1_Bp;
    auVar12[1] = in_XMM1_Bg;
    auVar12[0] = in_XMM1_Bf;
    auVar12[2] = in_XMM1_Bh;
    auVar12[3] = in_XMM1_Bi;
    auVar12[4] = in_XMM1_Bj;
    auVar12[5] = in_XMM1_Bk;
    auVar12[6] = in_XMM1_Bl;
    auVar12[7] = in_XMM1_Bm;
    auVar12[8] = in_XMM1_Bn;
    auVar12[9] = in_XMM1_Bo;
    auVar12[10] = in_XMM1_Bp;
    uVar22 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar3 = 0;
    if (uVar22 != 0) {
      for (; (uVar22 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar23 = (ulong)uVar3;
    pptVar25 = pptVar25 + uVar23;
    cVar1 = *(char *)((long)&(puVar30->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>.
                             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar23);
    puVar30 = (unique_ptr<int,_std::default_delete<int>_> *)
              ((long)&(puVar30->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar23);
  }
  local_d8 = (unique_ptr<int,_std::default_delete<int>_> *)
             ((long)&(puVar2->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl +
             (container->
             super_raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             ).capacity_);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (undefined1  [16])0x0;
  sVar28 = 0;
  local_98 = (pointer)0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00262e30;
  local_d0 = listener;
  if (puVar30 != local_d8) {
    sVar28 = 0;
    do {
      if (local_d0->stream_ != (ostream *)0x0) {
        PrintToString<std::unique_ptr<int,std::default_delete<int>>>
                  (&local_88,(testing *)*pptVar25,local_d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                   &local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
            &local_88.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                          local_88.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar26 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = sVar28;
      if ((this->matchers_).
          super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar26) {
        lVar27 = 0;
        lVar29 = 0;
        do {
          local_88._M_dataplus._M_p._0_1_ =
               MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>::MatchAndExplain
                         ((MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)
                          ((long)&(pMVar26->
                                  super_MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>
                                  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface
                          + lVar27),*pptVar25,&local_40);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    ((vector<char,_std::allocator<char>_> *)local_a8,(char *)&local_88);
          lVar29 = lVar29 + 1;
          pMVar26 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar27 = lVar27 + 0x18;
        } while (lVar29 != ((long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar26 >> 3) *
                           -0x5555555555555555);
      }
      pptVar25 = pptVar25 + 1;
      cVar1 = *(char *)((long)&(puVar30->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>
                               ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 1);
      puVar30 = (unique_ptr<int,_std::default_delete<int>_> *)
                ((long)&(puVar30->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1);
      while (cVar1 < -1) {
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*(char *)&(puVar30->_M_t).
                                 super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl < (char)iVar8);
        in_XMM1_Bb = -(*(char *)((long)&(puVar30->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1) <
                      (char)((uint)iVar8 >> 8));
        in_XMM1_Bc = -(*(char *)((long)&(puVar30->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 2) <
                      (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bd = -(*(char *)((long)&(puVar30->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 3) <
                      (char)((uint)iVar8 >> 0x18));
        in_XMM1_Be = -(*(char *)((long)&(puVar30->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) <
                      (char)iVar9);
        in_XMM1_Bf = -(*(char *)((long)&(puVar30->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 5) <
                      (char)((uint)iVar9 >> 8));
        in_XMM1_Bg = -(*(char *)((long)&(puVar30->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 6) <
                      (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bh = -(*(char *)((long)&(puVar30->_M_t).
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 7) <
                      (char)((uint)iVar9 >> 0x18));
        in_XMM1_Bi = -(*(char *)&puVar30[1]._M_t.
                                 super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl < (char)iVar10);
        in_XMM1_Bj = -(*(char *)((long)&puVar30[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1) <
                      (char)((uint)iVar10 >> 8));
        in_XMM1_Bk = -(*(char *)((long)&puVar30[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 2) <
                      (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bl = -(*(char *)((long)&puVar30[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 3) <
                      (char)((uint)iVar10 >> 0x18));
        in_XMM1_Bm = -(*(char *)((long)&puVar30[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) <
                      (char)iVar11);
        in_XMM1_Bn = -(*(char *)((long)&puVar30[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 5) <
                      (char)((uint)iVar11 >> 8));
        in_XMM1_Bo = -(*(char *)((long)&puVar30[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 6) <
                      (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bp = -(*(char *)((long)&puVar30[1]._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 7) <
                      (char)((uint)iVar11 >> 0x18));
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar7[1] = in_XMM1_Bb;
        auVar7[0] = in_XMM1_Ba;
        auVar7[2] = in_XMM1_Bc;
        auVar7[3] = in_XMM1_Bd;
        auVar7[4] = in_XMM1_Be;
        auVar7[5] = in_XMM1_Bf;
        auVar7[6] = in_XMM1_Bg;
        auVar7[7] = in_XMM1_Bh;
        auVar7[8] = in_XMM1_Bi;
        auVar7[9] = in_XMM1_Bj;
        auVar7[10] = in_XMM1_Bk;
        auVar7[0xb] = in_XMM1_Bl;
        auVar7[0xc] = in_XMM1_Bm;
        auVar7[0xd] = in_XMM1_Bn;
        auVar7[0xe] = in_XMM1_Bo;
        auVar7[0xf] = in_XMM1_Bp;
        auVar19[1] = in_XMM1_Bd;
        auVar19[0] = in_XMM1_Bc;
        auVar19[2] = in_XMM1_Be;
        auVar19[3] = in_XMM1_Bf;
        auVar19[4] = in_XMM1_Bg;
        auVar19[5] = in_XMM1_Bh;
        auVar19[6] = in_XMM1_Bi;
        auVar19[7] = in_XMM1_Bj;
        auVar19[8] = in_XMM1_Bk;
        auVar19[9] = in_XMM1_Bl;
        auVar19[10] = in_XMM1_Bm;
        auVar19[0xb] = in_XMM1_Bn;
        auVar19[0xc] = in_XMM1_Bo;
        auVar19[0xd] = in_XMM1_Bp;
        auVar17[1] = in_XMM1_Be;
        auVar17[0] = in_XMM1_Bd;
        auVar17[2] = in_XMM1_Bf;
        auVar17[3] = in_XMM1_Bg;
        auVar17[4] = in_XMM1_Bh;
        auVar17[5] = in_XMM1_Bi;
        auVar17[6] = in_XMM1_Bj;
        auVar17[7] = in_XMM1_Bk;
        auVar17[8] = in_XMM1_Bl;
        auVar17[9] = in_XMM1_Bm;
        auVar17[10] = in_XMM1_Bn;
        auVar17[0xb] = in_XMM1_Bo;
        auVar17[0xc] = in_XMM1_Bp;
        auVar15[1] = in_XMM1_Bf;
        auVar15[0] = in_XMM1_Be;
        auVar15[2] = in_XMM1_Bg;
        auVar15[3] = in_XMM1_Bh;
        auVar15[4] = in_XMM1_Bi;
        auVar15[5] = in_XMM1_Bj;
        auVar15[6] = in_XMM1_Bk;
        auVar15[7] = in_XMM1_Bl;
        auVar15[8] = in_XMM1_Bm;
        auVar15[9] = in_XMM1_Bn;
        auVar15[10] = in_XMM1_Bo;
        auVar15[0xb] = in_XMM1_Bp;
        auVar13[1] = in_XMM1_Bg;
        auVar13[0] = in_XMM1_Bf;
        auVar13[2] = in_XMM1_Bh;
        auVar13[3] = in_XMM1_Bi;
        auVar13[4] = in_XMM1_Bj;
        auVar13[5] = in_XMM1_Bk;
        auVar13[6] = in_XMM1_Bl;
        auVar13[7] = in_XMM1_Bm;
        auVar13[8] = in_XMM1_Bn;
        auVar13[9] = in_XMM1_Bo;
        auVar13[10] = in_XMM1_Bp;
        uVar22 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar3 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar23 = (ulong)uVar3;
        pptVar25 = pptVar25 + uVar23;
        cVar1 = *(char *)((long)&(puVar30->_M_t).
                                 super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar23);
        puVar30 = (unique_ptr<int,_std::default_delete<int>_> *)
                  ((long)&(puVar30->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                          .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl + uVar23);
      }
      sVar28 = local_b0 + 1;
    } while (puVar30 != local_d8);
  }
  local_68.num_matchers_ =
       ((long)(this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->matchers_).
              super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_88._M_dataplus._M_p._0_1_ = 0;
  local_68.num_elements_ = sVar28;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68.matched_,local_68.num_matchers_ * sVar28,(value_type *)&local_88,&local_d9);
  if (sVar28 != 0) {
    sVar24 = 0;
    pcVar21 = (pointer)local_a8._0_8_;
    do {
      if ((this->matchers_).
          super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar27 = 0;
        do {
          local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar27 + local_68.num_matchers_ * sVar24] =
               pcVar21[lVar27] != '\0';
          lVar27 = lVar27 + 1;
        } while (lVar27 != ((long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
        pcVar21 = pcVar21 + lVar27;
      }
      sVar24 = sVar24 + 1;
    } while (sVar24 != sVar28);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
  }
  bVar20 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                     (&this->super_UnorderedElementsAreMatcherImplBase,&local_c8,&local_68,local_d0)
  ;
  if (bVar20) {
    bVar20 = UnorderedElementsAreMatcherImplBase::FindPairing
                       (&this->super_UnorderedElementsAreMatcherImplBase,&local_68,local_d0);
  }
  else {
    bVar20 = false;
  }
  if (local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return bVar20;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }